

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O1

void __thiscall
SubprocessTestInterruptChildWithSigTerm::Run(SubprocessTestInterruptChildWithSigTerm *this)

{
  SubprocessSet *this_00;
  Test *this_01;
  bool bVar1;
  ExitStatus EVar2;
  Subprocess *this_02;
  string local_40;
  
  this_00 = &(this->super_SubprocessTest).subprocs_;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"kill -TERM $$","");
  this_02 = SubprocessSet::Add(this_00,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  bVar1 = testing::Test::Check
                    (g_current_test,this_02 != (Subprocess *)0x0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                     ,0x84,"(Subprocess *) 0 != subproc");
  if (bVar1) {
    (this->super_SubprocessTest).subprocs_.token_available_ = false;
    while( true ) {
      bVar1 = Subprocess::Done(this_02);
      if (bVar1) break;
      SubprocessSet::DoWork(this_00,(TokenPool *)0x0);
    }
    bVar1 = testing::Test::Check
                      (g_current_test,
                       (bool)((this->super_SubprocessTest).subprocs_.token_available_ ^ 1),
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                       ,0x8a,"subprocs_.IsTokenAvailable()");
    this_01 = g_current_test;
    if (bVar1) {
      EVar2 = Subprocess::Finish(this_02);
      testing::Test::Check
                (this_01,EVar2 == ExitInterrupted,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                 ,0x8c,"ExitInterrupted == subproc->Finish()");
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(SubprocessTest, InterruptChildWithSigTerm) {
  Subprocess* subproc = subprocs_.Add("kill -TERM $$");
  ASSERT_NE((Subprocess *) 0, subproc);

  subprocs_.ResetTokenAvailable();
  while (!subproc->Done()) {
    subprocs_.DoWork(NULL);
  }
  ASSERT_FALSE(subprocs_.IsTokenAvailable());

  EXPECT_EQ(ExitInterrupted, subproc->Finish());
}